

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

void __thiscall capnp::Type::requireUsableAs(Type *this,Type expected)

{
  uint uVar1;
  bool bVar2;
  Schema local_40 [3];
  Fault local_28;
  Fault f;
  Type *this_local;
  Type expected_local;
  
  this_local._0_2_ = expected.baseType;
  bVar2 = false;
  if (this->baseType == (Which)this_local) {
    this_local._2_1_ = expected.listDepth;
    bVar2 = this->listDepth == this_local._2_1_;
  }
  f.exception = (Exception *)this;
  if (!bVar2) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[60]>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
               ,0x395,FAILED,"baseType == expected.baseType && listDepth == expected.listDepth",
               "\"This type is not compatible with the requested native type.\"",
               (char (*) [60])"This type is not compatible with the requested native type.");
    kj::_::Debug::Fault::fatal(&local_28);
  }
  uVar1 = (uint)this->baseType;
  if (0xd < uVar1) {
    if (uVar1 == 0xe) {
      kj::_::unreachable();
    }
    if (uVar1 - 0xf < 3) {
      Schema::Schema(local_40,(this->field_4).schema);
      Schema::requireUsableAs(local_40,(expected.field_4.schema)->generic);
    }
  }
  return;
}

Assistant:

void Type::requireUsableAs(Type expected) const {
  KJ_REQUIRE(baseType == expected.baseType && listDepth == expected.listDepth,
             "This type is not compatible with the requested native type.");

  switch (baseType) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
    case schema::Type::ANY_POINTER:
      break;

    case schema::Type::STRUCT:
    case schema::Type::ENUM:
    case schema::Type::INTERFACE:
      Schema(schema).requireUsableAs(expected.schema->generic);
      break;

    case schema::Type::LIST:
      KJ_UNREACHABLE;
  }
}